

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_maxVecScalar_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  fVar1 = c->in[0].m_data[0];
  fVar2 = c->in[0].m_data[1];
  fVar3 = c->in[0].m_data[2];
  fVar4 = c->in[0].m_data[3];
  auVar6._0_4_ = (int)fVar1;
  auVar6._4_4_ = (int)fVar2;
  auVar6._8_4_ = (int)fVar3;
  auVar6._12_4_ = (int)fVar4;
  auVar9._0_4_ = auVar6._0_4_ >> 0x1f;
  auVar9._4_4_ = auVar6._4_4_ >> 0x1f;
  auVar9._8_4_ = auVar6._8_4_ >> 0x1f;
  auVar9._12_4_ = auVar6._12_4_ >> 0x1f;
  auVar10._0_4_ = (int)(fVar1 - 2.1474836e+09);
  auVar10._4_4_ = (int)(fVar2 - 2.1474836e+09);
  auVar10._8_4_ = (int)(fVar3 - 2.1474836e+09);
  auVar10._12_4_ = (int)(fVar4 - 2.1474836e+09);
  auVar6 = auVar10 & auVar9 | auVar6;
  auVar7._0_12_ = auVar6._4_12_;
  auVar7._12_4_ = auVar6._0_4_;
  uVar5 = (undefined4)(long)c->in[1].m_data[0];
  auVar8._4_4_ = uVar5;
  auVar8._0_4_ = uVar5;
  auVar8._8_4_ = uVar5;
  auVar8._12_4_ = uVar5;
  auVar6 = auVar8 ^ _DAT_019ec5b0;
  auVar10 = _DAT_019ec5b0 ^ auVar7;
  auVar11._0_4_ = -(uint)(auVar6._0_4_ < auVar10._0_4_);
  auVar11._4_4_ = -(uint)(auVar6._4_4_ < auVar10._4_4_);
  auVar11._8_4_ = -(uint)(auVar6._8_4_ < auVar10._8_4_);
  auVar11._12_4_ = -(uint)(auVar6._12_4_ < auVar10._12_4_);
  auVar6 = ~auVar11 & auVar8 | auVar7 & auVar11;
  auVar10 = _DAT_01a16490 & auVar6 | _DAT_01a57080;
  (c->color).m_data[0] = ((float)(auVar6._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) + auVar10._0_4_
  ;
  (c->color).m_data[1] = ((float)(auVar6._4_4_ >> 0x10 | 0x53000000) - 5.497642e+11) + auVar10._4_4_
  ;
  (c->color).m_data[2] = ((float)(auVar6._8_4_ >> 0x10 | 0x53000000) - 5.497642e+11) + auVar10._8_4_
  ;
  (c->color).m_data[3] =
       ((float)(auVar6._12_4_ >> 0x10 | 0x53000000) - 5.497642e+11) + auVar10._12_4_;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }